

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Kumu::km_token_split
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,string *separator)

{
  char *pcVar1;
  char *__haystack;
  string tmp_str;
  allocator<char> local_51;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  __haystack = (str->_M_dataplus)._M_p;
  pcVar1 = strstr(__haystack,(separator->_M_dataplus)._M_p);
  while( true ) {
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__haystack,&local_51);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    if (pcVar1 < __haystack) break;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&local_50,(ulong)__haystack);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
    __haystack = pcVar1 + separator->_M_string_length;
    pcVar1 = strstr(__haystack,(separator->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __assert_fail("r >= pstr",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x4d9,
                "std::list<std::string> Kumu::km_token_split(const std::string &, const std::string &)"
               );
}

Assistant:

std::list<std::string>
Kumu::km_token_split(const std::string& str, const std::string& separator)
{
  std::list<std::string> components;
  const char* pstr = str.c_str();
  const char* r = strstr(pstr, separator.c_str());

  while ( r != 0 )
    {
      assert(r >= pstr);
      std::string tmp_str;
      tmp_str.assign(pstr, r - pstr);
      components.push_back(tmp_str);
      pstr = r + separator.size();
      r = strstr(pstr, separator.c_str());
    }
      
  components.push_back(std::string(pstr));
  return components;
}